

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

void j2k_write_eoc(opj_j2k_t *j2k)

{
  opj_cio_t *in_RDI;
  opj_cio_t *cio;
  int in_stack_ffffffffffffffec;
  
  cio_write(in_RDI,(unsigned_long_long)in_RDI[2].cinfo,in_stack_ffffffffffffffec);
  return;
}

Assistant:

static void j2k_write_eoc(opj_j2k_t *j2k) {
	opj_cio_t *cio = j2k->cio;
	/* opj_event_msg(j2k->cinfo, "%.8x: EOC\n", cio_tell(cio) + j2k->pos_correction); */
	cio_write(cio, J2K_MS_EOC, 2);

/* UniPG>> */
#ifdef USE_JPWL
	/* update markers struct */
	j2k_add_marker(j2k->cstr_info, J2K_MS_EOC, cio_tell(cio) - 2, 2);
#endif /* USE_JPWL */
/* <<UniPG */
}